

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O1

void __thiscall TTD::SnapShot::Inflate(SnapShot *this,InflateMap *inflator,ThreadContextTTD *tCtx)

{
  PropertyId propertyId;
  fPtr_DoAddtlValueInstantiation p_Var1;
  bool bVar2;
  uint32 uVar3;
  Type *value;
  FrameDisplay *value_00;
  RecyclableObject *obj;
  DynamicObject *obj_00;
  ScriptContext *intoCtx;
  ThreadContext *pTVar4;
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  Recycler *alloc;
  HashedCharacterBuffer<char16_t> *this_01;
  FunctionBodyResolveInfo *fbInfo;
  UnorderedArrayListLink *pUVar5;
  UnorderedArrayListLink *pUVar6;
  FunctionBodyResolveInfo *pFVar7;
  SnapPrimitiveValue *snapValue;
  SnapObject *pSVar8;
  SlotArrayInfo *slotInfo;
  ScriptFunctionScopeInfo *funcScopeInfo;
  SnapContext *snpCtx;
  UnorderedArrayListLink *pUVar9;
  UnorderedArrayListLink *pUVar10;
  UnorderedArrayListLink *pUVar11;
  UnorderedArrayListLink *pUVar12;
  UnorderedArrayListLink *pUVar13;
  PropertyId *pPVar14;
  SnapObject *pSVar15;
  PropertyId *pPVar16;
  FunctionBodyResolveInfo *pFVar17;
  SnapPrimitiveValue *pSVar18;
  SlotArrayInfo *pSVar19;
  ScriptFunctionScopeInfo *pSVar20;
  SnapContext *pSVar21;
  HashedCharacterBuffer<char16_t> *local_b8;
  HashedCharacterBuffer<char16_t> *propertyName;
  TrackAllocData data;
  PropertyRecord *pRecord;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
  idToSnpBodyMap;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> idToSnpObjectMap;
  
  pRecord = (PropertyRecord *)0x0;
  idToSnpBodyMap.m_h1Prime = 0;
  idToSnpBodyMap.m_capacity = 0;
  idToSnpBodyMap._12_4_ = 0;
  idToSnpBodyMap.m_hashArray._0_4_ = 0;
  uVar3 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Count
                    (&this->m_functionBodyList);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>::Initialize
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*> *
             )&pRecord,uVar3);
  pFVar17 = (this->m_functionBodyList).m_inlineHeadBlock.CurrPos;
  pFVar7 = (this->m_functionBodyList).m_inlineHeadBlock.BlockData;
  if (pFVar7 != (FunctionBodyResolveInfo *)0x0 && pFVar7 != pFVar17) {
    pUVar5 = (this->m_functionBodyList).m_inlineHeadBlock.Next;
    do {
      propertyName = (HashedCharacterBuffer<char16_t> *)pFVar7;
      TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>::AddItem
                ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
                  *)&pRecord,pFVar7->FunctionBodyId,(FunctionBodyResolveInfo **)&propertyName);
      pFVar7 = pFVar7 + 1;
      if (pFVar7 == pFVar17) {
        if (pUVar5 == (UnorderedArrayListLink *)0x0) {
          pFVar7 = (FunctionBodyResolveInfo *)0x0;
        }
        else {
          pFVar17 = pUVar5->CurrPos;
          pFVar7 = pUVar5->BlockData;
          pUVar5 = pUVar5->Next;
        }
      }
    } while (pFVar7 != (FunctionBodyResolveInfo *)0x0);
  }
  idToSnpBodyMap.m_count = 0;
  idToSnpBodyMap._28_4_ = 0;
  uVar3 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                    (&this->m_compoundObjectList);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>::Initialize
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> *)
             &idToSnpBodyMap.m_count,uVar3);
  pSVar15 = (this->m_compoundObjectList).m_inlineHeadBlock.CurrPos;
  pSVar8 = (this->m_compoundObjectList).m_inlineHeadBlock.BlockData;
  if (pSVar8 != (SnapObject *)0x0 && pSVar8 != pSVar15) {
    pUVar6 = (this->m_compoundObjectList).m_inlineHeadBlock.Next;
    do {
      propertyName = (HashedCharacterBuffer<char16_t> *)pSVar8;
      TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>::AddItem
                ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> *)
                 &idToSnpBodyMap.m_count,pSVar8->ObjectPtrId,(SnapObject **)&propertyName);
      pSVar8 = pSVar8 + 1;
      if (pSVar8 == pSVar15) {
        if (pUVar6 == (UnorderedArrayListLink *)0x0) {
          pSVar8 = (SnapObject *)0x0;
        }
        else {
          pSVar15 = pUVar6->CurrPos;
          pSVar8 = pUVar6->BlockData;
          pUVar6 = pUVar6->Next;
        }
      }
    } while (pSVar8 != (SnapObject *)0x0);
  }
  pFVar17 = (this->m_functionBodyList).m_inlineHeadBlock.CurrPos;
  pFVar7 = (this->m_functionBodyList).m_inlineHeadBlock.BlockData;
  if (pFVar7 != (FunctionBodyResolveInfo *)0x0 && pFVar7 != pFVar17) {
    pUVar5 = (this->m_functionBodyList).m_inlineHeadBlock.Next;
    do {
      NSSnapValues::InflateFunctionBody
                (pFVar7,inflator,
                 (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
                  *)&pRecord);
      pFVar7 = pFVar7 + 1;
      if (pFVar7 == pFVar17) {
        if (pUVar5 == (UnorderedArrayListLink *)0x0) {
          pFVar7 = (FunctionBodyResolveInfo *)0x0;
        }
        else {
          pFVar17 = pUVar5->CurrPos;
          pFVar7 = pUVar5->BlockData;
          pUVar5 = pUVar5->Next;
        }
      }
    } while (pFVar7 != (FunctionBodyResolveInfo *)0x0);
  }
  pSVar18 = (this->m_primitiveObjectList).m_inlineHeadBlock.CurrPos;
  snapValue = (this->m_primitiveObjectList).m_inlineHeadBlock.BlockData;
  if (snapValue != (SnapPrimitiveValue *)0x0 && snapValue != pSVar18) {
    pUVar10 = (this->m_primitiveObjectList).m_inlineHeadBlock.Next;
    do {
      NSSnapValues::InflateSnapPrimitiveValue(snapValue,inflator);
      snapValue = snapValue + 1;
      if (snapValue == pSVar18) {
        if (pUVar10 == (UnorderedArrayListLink *)0x0) {
          snapValue = (SnapPrimitiveValue *)0x0;
        }
        else {
          pSVar18 = pUVar10->CurrPos;
          snapValue = pUVar10->BlockData;
          pUVar10 = pUVar10->Next;
        }
      }
    } while (snapValue != (SnapPrimitiveValue *)0x0);
  }
  pSVar15 = (this->m_compoundObjectList).m_inlineHeadBlock.CurrPos;
  pSVar8 = (this->m_compoundObjectList).m_inlineHeadBlock.BlockData;
  if (pSVar8 != (SnapObject *)0x0 && pSVar8 != pSVar15) {
    pUVar6 = (this->m_compoundObjectList).m_inlineHeadBlock.Next;
    do {
      InflateSingleObject(this,pSVar8,inflator,
                          (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>
                           *)&idToSnpBodyMap.m_count);
      pSVar8 = pSVar8 + 1;
      if (pSVar8 == pSVar15) {
        if (pUVar6 == (UnorderedArrayListLink *)0x0) {
          pSVar8 = (SnapObject *)0x0;
        }
        else {
          pSVar15 = pUVar6->CurrPos;
          pSVar8 = pUVar6->BlockData;
          pUVar6 = pUVar6->Next;
        }
      }
    } while (pSVar8 != (SnapObject *)0x0);
  }
  pSVar19 = (this->m_slotArrayEntries).m_inlineHeadBlock.CurrPos;
  slotInfo = (this->m_slotArrayEntries).m_inlineHeadBlock.BlockData;
  if (slotInfo != (SlotArrayInfo *)0x0 && slotInfo != pSVar19) {
    pUVar11 = (this->m_slotArrayEntries).m_inlineHeadBlock.Next;
    do {
      value = NSSnapValues::InflateSlotArrayInfo(slotInfo,inflator);
      InflateMap::AddSlotArray(inflator,slotInfo->SlotId,value);
      slotInfo = slotInfo + 1;
      if (slotInfo == pSVar19) {
        if (pUVar11 == (UnorderedArrayListLink *)0x0) {
          slotInfo = (SlotArrayInfo *)0x0;
        }
        else {
          pSVar19 = pUVar11->CurrPos;
          slotInfo = pUVar11->BlockData;
          pUVar11 = pUVar11->Next;
        }
      }
    } while (slotInfo != (SlotArrayInfo *)0x0);
  }
  pSVar20 = (this->m_scopeEntries).m_inlineHeadBlock.CurrPos;
  funcScopeInfo = (this->m_scopeEntries).m_inlineHeadBlock.BlockData;
  if (funcScopeInfo != (ScriptFunctionScopeInfo *)0x0 && funcScopeInfo != pSVar20) {
    pUVar12 = (this->m_scopeEntries).m_inlineHeadBlock.Next;
    do {
      value_00 = NSSnapValues::InflateScriptFunctionScopeInfo(funcScopeInfo,inflator);
      InflateMap::AddEnvironment(inflator,funcScopeInfo->ScopeId,value_00);
      funcScopeInfo = funcScopeInfo + 1;
      if (funcScopeInfo == pSVar20) {
        if (pUVar12 == (UnorderedArrayListLink *)0x0) {
          funcScopeInfo = (ScriptFunctionScopeInfo *)0x0;
        }
        else {
          pSVar20 = pUVar12->CurrPos;
          funcScopeInfo = pUVar12->BlockData;
          pUVar12 = pUVar12->Next;
        }
      }
    } while (funcScopeInfo != (ScriptFunctionScopeInfo *)0x0);
  }
  pSVar15 = (this->m_compoundObjectList).m_inlineHeadBlock.CurrPos;
  pSVar8 = (this->m_compoundObjectList).m_inlineHeadBlock.BlockData;
  if (pSVar8 != (SnapObject *)0x0 && pSVar8 != pSVar15) {
    pUVar6 = (this->m_compoundObjectList).m_inlineHeadBlock.Next;
    do {
      obj = InflateMap::LookupObject(inflator,pSVar8->ObjectPtrId);
      p_Var1 = this->m_snapObjectVTableArray[pSVar8->SnapObjectTag].AddtlInstationationFunc;
      if (p_Var1 != (fPtr_DoAddtlValueInstantiation)0x0) {
        (*p_Var1)(pSVar8,obj,inflator);
      }
      bVar2 = Js::DynamicType::Is(pSVar8->SnapType->JsTypeId);
      if (bVar2) {
        obj_00 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
        NSSnapObjects::StdPropertyRestore(pSVar8,obj_00,inflator);
      }
      pSVar8 = pSVar8 + 1;
      if (pSVar8 == pSVar15) {
        if (pUVar6 == (UnorderedArrayListLink *)0x0) {
          pSVar8 = (SnapObject *)0x0;
        }
        else {
          pSVar15 = pUVar6->CurrPos;
          pSVar8 = pUVar6->BlockData;
          pUVar6 = pUVar6->Next;
        }
      }
    } while (pSVar8 != (SnapObject *)0x0);
  }
  ReLinkThreadContextInfo(this,inflator,tCtx);
  pSVar21 = (this->m_ctxList).m_inlineHeadBlock.CurrPos;
  snpCtx = (this->m_ctxList).m_inlineHeadBlock.BlockData;
  if (snpCtx != (SnapContext *)0x0 && snpCtx != pSVar21) {
    pUVar13 = (this->m_ctxList).m_inlineHeadBlock.Next;
    do {
      intoCtx = InflateMap::LookupScriptContext(inflator,snpCtx->ScriptContextLogId);
      NSSnapValues::ResetPendingAsyncBufferModInfo(snpCtx,intoCtx,inflator);
      snpCtx = snpCtx + 1;
      if (snpCtx == pSVar21) {
        if (pUVar13 == (UnorderedArrayListLink *)0x0) {
          snpCtx = (SnapContext *)0x0;
        }
        else {
          pSVar21 = pUVar13->CurrPos;
          snpCtx = pUVar13->BlockData;
          pUVar13 = pUVar13->Next;
        }
      }
    } while (snpCtx != (SnapContext *)0x0);
  }
  pTVar4 = ThreadContextTTD::GetThreadContext(tCtx);
  this_00 = ThreadContext::GetSymbolRegistrationMap_TTD(pTVar4);
  JsUtil::
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(this_00);
  pPVar14 = (this->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.CurrPos;
  pPVar16 = (this->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.BlockData;
  if (pPVar16 != (PropertyId *)0x0 && pPVar16 != pPVar14) {
    pUVar9 = (this->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.Next;
    do {
      propertyId = *pPVar16;
      pTVar4 = ThreadContextTTD::GetThreadContext(tCtx);
      data._32_8_ = ThreadContext::GetPropertyName(pTVar4,propertyId);
      pTVar4 = ThreadContextTTD::GetThreadContext(tCtx);
      propertyName = (HashedCharacterBuffer<char16_t> *)
                     &Js::HashedCharacterBuffer<char16_t>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_430a7b6;
      data.filename._0_4_ = 0x275;
      alloc = Memory::Recycler::TrackAllocInfo(pTVar4->recycler,(TrackAllocData *)&propertyName);
      this_01 = (HashedCharacterBuffer<char16_t> *)new<Memory::Recycler>(0x10,alloc,0x38bbb2);
      Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer
                (this_01,(char16_t *)(data._32_8_ + 0x18),*(uint *)(data._32_8_ + 0x14) >> 1);
      local_b8 = this_01;
      JsUtil::
      BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_00,&local_b8,(PropertyRecord **)&data.line);
      pPVar16 = pPVar16 + 1;
      if (pPVar16 == pPVar14) {
        if (pUVar9 == (UnorderedArrayListLink *)0x0) {
          pPVar16 = (PropertyId *)0x0;
        }
        else {
          pPVar14 = pUVar9->CurrPos;
          pPVar16 = pUVar9->BlockData;
          pUVar9 = pUVar9->Next;
        }
      }
    } while (pPVar16 != (PropertyId *)0x0);
  }
  if (idToSnpBodyMap._8_8_ != 0) {
    Memory::
    DeleteArray<Memory::HeapAllocator,TTD::TTDIdentifierDictionary<unsigned_long,TTD::NSSnapValues::FunctionBodyResolveInfo*>::Entry>
              (&Memory::HeapAllocator::Instance,(ulong)idToSnpBodyMap.m_h1Prime,
               (Entry *)idToSnpBodyMap._8_8_);
  }
  return;
}

Assistant:

void SnapShot::Inflate(InflateMap* inflator, ThreadContextTTD* tCtx) const
    {
        //We assume the caller has inflated all of the ScriptContexts for us and we are just filling in the objects

        ////

        //set the map from all function body ids to their snap representations
        TTDIdentifierDictionary<TTD_PTR_ID, NSSnapValues::FunctionBodyResolveInfo*> idToSnpBodyMap;
        idToSnpBodyMap.Initialize(this->m_functionBodyList.Count());

        for(auto iter = this->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            idToSnpBodyMap.AddItem(iter.Current()->FunctionBodyId, iter.Current());
        }

        //set the map from all compound object ids to their snap representations
        TTDIdentifierDictionary<TTD_PTR_ID, NSSnapObjects::SnapObject*> idToSnpObjectMap;
        idToSnpObjectMap.Initialize(this->m_compoundObjectList.Count());

        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            idToSnpObjectMap.AddItem(iter.Current()->ObjectPtrId, iter.Current());
        }

        ////

        //inflate all the function bodies
        for(auto iter = this->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::FunctionBodyResolveInfo* fbInfo = iter.Current();
            NSSnapValues::InflateFunctionBody(fbInfo, inflator, idToSnpBodyMap);
        }

        //inflate all the primitive objects
        for(auto iter = this->m_primitiveObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapPrimitiveValue* pSnap = iter.Current();
            NSSnapValues::InflateSnapPrimitiveValue(pSnap, inflator);
        }

        //inflate all the regular objects
        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapObjects::SnapObject* sObj = iter.Current();
            this->InflateSingleObject(sObj, inflator, idToSnpObjectMap);
        }

        //take care of all the slot arrays
        for(auto iter = this->m_slotArrayEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SlotArrayInfo* sai = iter.Current();
            Field(Js::Var)* slots = NSSnapValues::InflateSlotArrayInfo(sai, inflator);

            inflator->AddSlotArray(sai->SlotId, slots);
        }

        //and the scope entries
        for(auto iter = this->m_scopeEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::ScriptFunctionScopeInfo* sfsi = iter.Current();
            Js::FrameDisplay* frame = NSSnapValues::InflateScriptFunctionScopeInfo(sfsi, inflator);

            inflator->AddEnvironment(sfsi->ScopeId, frame);
        }

        //Link up the object pointers
        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapObjects::SnapObject* sobj = iter.Current();
            Js::RecyclableObject* iobj = inflator->LookupObject(sobj->ObjectPtrId);

            NSSnapObjects::fPtr_DoAddtlValueInstantiation addtlInstFPtr = this->m_snapObjectVTableArray[(uint32)sobj->SnapObjectTag].AddtlInstationationFunc;
            if(addtlInstFPtr != nullptr)
            {
                addtlInstFPtr(sobj, iobj, inflator);
            }

            if(Js::DynamicType::Is(sobj->SnapType->JsTypeId))
            {
                NSSnapObjects::StdPropertyRestore(sobj, Js::VarTo<Js::DynamicObject>(iobj), inflator);
            }
        }

        this->ReLinkThreadContextInfo(inflator, tCtx);

        for(auto iter = this->m_ctxList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapContext* snpCtx = iter.Current();
            Js::ScriptContext* sctx = inflator->LookupScriptContext(snpCtx->ScriptContextLogId);

            NSSnapValues::ResetPendingAsyncBufferModInfo(snpCtx, sctx, inflator);
        }

        //reset the threadContext symbol map
        JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16>*, const Js::PropertyRecord*, Recycler, PowerOf2SizePolicy, Js::PropertyRecordStringHashComparer>* tcSymbolRegistrationMap = tCtx->GetThreadContext()->GetSymbolRegistrationMap_TTD();
        tcSymbolRegistrationMap->Clear();

        for(auto iter = this->m_tcSymbolRegistrationMapContents.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            Js::PropertyId pid = *iter.Current();
            const Js::PropertyRecord* pRecord = tCtx->GetThreadContext()->GetPropertyName(pid);
            Js::HashedCharacterBuffer<char16> * propertyName = RecyclerNew(tCtx->GetThreadContext()->GetRecycler(), Js::HashedCharacterBuffer<char16>, pRecord->GetBuffer(), pRecord->GetLength());

            tcSymbolRegistrationMap->Add(propertyName, pRecord);
        }
    }